

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int omp_get_place_num_procs(int place_num)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar4;
  uint in_EDI;
  kmp_affin_mask_t *mask;
  int retval;
  int i;
  int local_10;
  uint local_c;
  int local_4;
  long *plVar3;
  
  local_10 = 0;
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if (__kmp_affin_mask_size == 0) {
    local_4 = 0;
  }
  else if (((int)in_EDI < 0) || ((int)__kmp_affinity_num_masks <= (int)in_EDI)) {
    local_4 = 0;
  }
  else {
    iVar1 = (*__kmp_affinity_dispatch->_vptr_KMPAffinity[8])
                      (__kmp_affinity_dispatch,__kmp_affinity_masks,(ulong)in_EDI);
    plVar3 = (long *)CONCAT44(extraout_var,iVar1);
    for (local_c = (**(code **)(*plVar3 + 0x50))(); uVar2 = (**(code **)(*plVar3 + 0x58))(),
        local_c != uVar2; local_c = (**(code **)(*plVar3 + 0x60))(plVar3,local_c)) {
      uVar2 = (*__kmp_affin_fullMask->_vptr_Mask[3])(__kmp_affin_fullMask,(ulong)local_c);
      if (((uVar2 & 1) != 0) &&
         (uVar4 = (**(code **)(*plVar3 + 0x18))(plVar3,local_c), (uVar4 & 1) != 0)) {
        local_10 = local_10 + 1;
      }
    }
    local_4 = local_10;
  }
  return local_4;
}

Assistant:

int FTN_STDCALL FTN_GET_PLACE_NUM_PROCS(int place_num) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  int i;
  int retval = 0;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  if (place_num < 0 || place_num >= (int)__kmp_affinity_num_masks)
    return 0;
  kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
  KMP_CPU_SET_ITERATE(i, mask) {
    if ((!KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
        (!KMP_CPU_ISSET(i, mask))) {
      continue;
    }
    ++retval;
  }
  return retval;
#endif
}